

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall helics::BrokerBase::queueProcessingLoop(BrokerBase *this)

{
  bool bVar1;
  BrokerState BVar2;
  action_t aVar3;
  __int_type_conflict _Var4;
  Time *this_00;
  BrokerBase *in_RDI;
  optional<helics::ActionMessage> tcmd;
  optional<helics::ActionMessage> tcmd_1;
  type timeDiff_1;
  time_point ctime_1;
  ActionMessage dDisable;
  time_point currTime;
  type timeDiff;
  time_point ctime;
  action_t ret;
  ActionMessage command;
  anon_class_16_2_af978e1b logDump;
  int messagesSinceLastTick;
  time_point timeStart;
  anon_class_32_4_dda494f4 timerStop;
  type timerCallback;
  activeProtector active;
  steady_timer ticktimer;
  LoopHandle contextLoop;
  shared_ptr<gmlc::networking::AsioContextManager> serv;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> dumpMessages;
  ActionMessage *in_stack_fffffffffffff6d8;
  BrokerBase *in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e8;
  int in_stack_fffffffffffff6ec;
  nanoseconds in_stack_fffffffffffff6f0;
  time_point *in_stack_fffffffffffff6f8;
  undefined7 in_stack_fffffffffffff700;
  byte in_stack_fffffffffffff707;
  Time *in_stack_fffffffffffff708;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffff710;
  undefined7 in_stack_fffffffffffff718;
  strong_ordering in_stack_fffffffffffff71f;
  milliseconds in_stack_fffffffffffff720;
  string *in_stack_fffffffffffff768;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffff7a8;
  ActionMessage *command_00;
  undefined1 in_stack_fffffffffffff83b;
  int in_stack_fffffffffffff83c;
  BrokerBase *in_stack_fffffffffffff840;
  string_view in_stack_fffffffffffff848;
  GlobalFederateId in_stack_fffffffffffff85c;
  AsioContextManager *in_stack_fffffffffffff868;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffff8a8;
  allocator<char> local_739 [65];
  __sv_type local_6f8;
  __sv_type local_6e8;
  BaseType local_6d8;
  GlobalFederateId local_6d4 [21];
  string_view in_stack_fffffffffffff980;
  ActionMessage *in_stack_fffffffffffff9a0;
  time_point local_529 [8];
  __sv_type local_4e8;
  __sv_type local_4d8;
  BaseType local_4c8;
  GlobalFederateId local_4c4 [49];
  undefined4 local_400;
  int local_3fc;
  duration<long,std::ratio<1l,1000l>> local_3f8 [12];
  undefined4 local_3ec;
  rep local_3e8;
  TimeRepresentation<count_time<9,_long>_> local_3e0;
  __unspec local_3d1;
  rep local_3d0;
  type local_3c1;
  rep local_3c0;
  undefined8 local_3b8;
  undefined1 local_3ac;
  undefined1 local_3ab;
  pair<bool,_bool> local_3aa;
  rep local_3a8;
  duration local_3a0;
  BaseType local_398;
  GlobalFederateId local_394;
  BaseType local_390;
  GlobalFederateId local_38c [3];
  BaseType local_380;
  BaseType local_378;
  __unspec local_2c9;
  rep local_2c8;
  rep local_2c0;
  type local_2b1;
  undefined8 local_2b0;
  undefined1 local_2a4;
  undefined1 local_2a3;
  pair<bool,_bool> local_2a2;
  rep local_2a0;
  duration local_298;
  __unspec local_289;
  rep local_288;
  type local_279;
  rep local_278;
  undefined8 local_270;
  action_t local_25c;
  ActionMessage local_258;
  int local_19c;
  undefined1 *local_190;
  int local_188;
  BaseType local_184;
  undefined8 local_180;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  rep local_158;
  undefined8 local_150;
  duration local_148;
  undefined1 local_13c;
  undefined1 local_13b;
  pair<bool,_bool> local_13a;
  baseType local_138;
  TimeRepresentation<count_time<9,_long>_> local_130 [2];
  undefined1 *local_120;
  undefined1 local_112;
  undefined1 local_111;
  undefined1 local_110 [48];
  undefined1 local_e0 [120];
  undefined1 local_68 [24];
  
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  if (bVar1) {
    CLI::std::atomic<bool>::store
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
               SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x38,0),
               (memory_order)in_stack_fffffffffffff6e0);
  }
  else {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::vector
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x517cae);
    command_00 = (ActionMessage *)&stack0xffffffffffffffb0;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff6f0.__r);
    gmlc::networking::AsioContextManager::getContextPointer(in_stack_fffffffffffff768);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff6e0);
    std::
    __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x517cf4);
    gmlc::networking::AsioContextManager::startContextLoop(in_stack_fffffffffffff868);
    std::
    __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x517d13);
    gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x517d1b);
    ::asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::basic_waitable_timer<asio::io_context>
              ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                *)in_stack_fffffffffffff6e0,(io_context *)in_stack_fffffffffffff6d8,0);
    local_111 = 1;
    local_112 = 0;
    gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::guarded<bool,bool>
              ((guarded<std::pair<bool,_bool>,_std::mutex> *)in_stack_fffffffffffff6f0.__r,
               (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
               (bool *)in_stack_fffffffffffff6e0);
    local_120 = local_110;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                      (&in_RDI->tickTimer,
                       (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    if ((bVar1) && ((in_RDI->disable_timer & 1U) == 0)) {
      this_00 = &in_RDI->tickTimer;
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffff6e0,
                 (double)in_stack_fffffffffffff6d8);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(this_00,local_130);
      if (bVar1) {
        TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                  ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffff6e0,
                   (double)in_stack_fffffffffffff6d8);
        (in_RDI->tickTimer).internalTimeCode = local_138;
      }
      local_13b = 1;
      local_13c = 1;
      local_13a = std::make_pair<bool,bool>((bool *)in_stack_fffffffffffff6d8,(bool *)0x517ec3);
      gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                ((guarded<std::pair<bool,_bool>,_std::mutex> *)in_stack_fffffffffffff6f0.__r,
                 (pair<bool,_bool> *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      local_150 = std::chrono::_V2::steady_clock::now();
      local_158 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ns
                                 ((TimeRepresentation<count_time<9,_long>_> *)
                                  in_stack_fffffffffffff6d8);
      in_stack_fffffffffffff7a8 =
           std::chrono::operator+
                     ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                      (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff6e0);
      local_148 = in_stack_fffffffffffff7a8.__d.__r;
      ::asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                    *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
                   in_stack_fffffffffffff6f8);
      ::asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::
      async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  *)in_stack_fffffffffffff6e0,(type *)in_stack_fffffffffffff6d8);
    }
    local_170 = local_110;
    local_168 = local_e0;
    local_160 = local_68;
    local_180 = std::chrono::_V2::steady_clock::now();
    local_184 = (BaseType)CLI::std::atomic<helics::GlobalBrokerId>::load(&in_RDI->global_id,seq_cst)
    ;
    (in_RDI->global_broker_id_local).gid = local_184;
    local_188 = 0;
    local_190 = &stack0xffffffffffffffe0;
    bVar1 = std::atomic::operator_cast_to_bool
                      ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)
                      );
    if (bVar1) {
      queueProcessingLoop::anon_class_32_4_dda494f4::operator()
                ((anon_class_32_4_dda494f4 *)in_stack_fffffffffffff720.__r);
      CLI::std::atomic<bool>::store
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                 SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x38,0),
                 (memory_order)in_stack_fffffffffffff6e0);
      local_19c = 1;
    }
    else {
      do {
        gmlc::containers::
        BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
                  (in_stack_fffffffffffff8a8);
        CLI::std::__atomic_base<unsigned_long>::operator++
                  (&(in_RDI->messageCounter).super___atomic_base<unsigned_long>);
        if ((in_RDI->dumplog & 1U) != 0) {
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     in_stack_fffffffffffff6f0.__r,
                     (value_type *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        }
        aVar3 = ActionMessage::action(&local_258);
        if (aVar3 == cmd_ignore) {
          local_19c = 2;
        }
        else {
          local_25c = commandProcessor(in_RDI,command_00);
          if (local_25c == cmd_ignore) {
            local_188 = local_188 + 1;
            local_19c = 2;
          }
          else {
            if (local_25c != cmd_ignore) {
              if (local_25c != cmd_tick) {
                if (local_25c == cmd_stop) {
                  queueProcessingLoop::anon_class_32_4_dda494f4::operator()
                            ((anon_class_32_4_dda494f4 *)in_stack_fffffffffffff720.__r);
                  bVar1 = std::atomic::operator_cast_to_bool
                                    ((atomic<bool> *)
                                     CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
                  if (!bVar1) {
                    (*in_RDI->_vptr_BrokerBase[5])(in_RDI,&local_258);
                    CLI::std::atomic<bool>::store
                              ((atomic<bool> *)
                               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                               SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x38,0),
                               (memory_order)in_stack_fffffffffffff6e0);
                    queueProcessingLoop::anon_class_16_2_af978e1b::operator()
                              ((anon_class_16_2_af978e1b *)in_stack_fffffffffffff7a8.__d.__r);
                    (*in_RDI->_vptr_BrokerBase[3])(in_RDI,0);
                  }
                  gmlc::containers::
                  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                  ::try_pop((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                             *)CONCAT17(in_stack_fffffffffffff71f._M_value,in_stack_fffffffffffff718
                                       ));
                  while (bVar1 = std::optional::operator_cast_to_bool
                                           ((optional<helics::ActionMessage> *)0x518de8), bVar1) {
                    std::optional<helics::ActionMessage>::operator*
                              ((optional<helics::ActionMessage> *)0x518dfe);
                    bVar1 = isDisconnectCommand((ActionMessage *)
                                                CONCAT44(in_stack_fffffffffffff6ec,
                                                         in_stack_fffffffffffff6e8));
                    if ((!bVar1) &&
                       (_Var4 = std::__atomic_base::operator_cast_to_int
                                          ((__atomic_base<int> *)
                                           CONCAT44(in_stack_fffffffffffff6ec,
                                                    in_stack_fffffffffffff6e8)), 0x17 < _Var4)) {
                      local_6d8 = (in_RDI->global_broker_id_local).gid;
                      GlobalFederateId::GlobalFederateId(local_6d4,(GlobalBrokerId)local_6d8);
                      local_6e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffff6e0);
                      in_stack_fffffffffffff6f0.__r = (rep)local_739;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff720.__r,
                                 (char *)CONCAT17(in_stack_fffffffffffff71f._M_value,
                                                  in_stack_fffffffffffff718),
                                 (allocator<char> *)in_stack_fffffffffffff710.__r);
                      std::optional<helics::ActionMessage>::operator*
                                ((optional<helics::ActionMessage> *)0x518ea9);
                      prettyPrintString_abi_cxx11_(in_stack_fffffffffffff9a0);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffff71f._M_value,
                                                 in_stack_fffffffffffff718),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff710.__r);
                      local_6f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffff6e0);
                      in_stack_fffffffffffff6d8 = (ActionMessage *)local_6f8._M_len;
                      in_stack_fffffffffffff6e0 = (BrokerBase *)local_6f8._M_str;
                      sendToLogger(in_stack_fffffffffffff840,in_stack_fffffffffffff85c,
                                   in_stack_fffffffffffff83c,in_stack_fffffffffffff848,
                                   in_stack_fffffffffffff980,(bool)in_stack_fffffffffffff83b);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff6e0);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff6e0);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff6e0);
                      std::allocator<char>::~allocator(local_739);
                    }
                    gmlc::containers::
                    BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                    ::try_pop((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                               *)CONCAT17(in_stack_fffffffffffff71f._M_value,
                                          in_stack_fffffffffffff718));
                    std::optional<helics::ActionMessage>::operator=
                              ((optional<helics::ActionMessage> *)in_stack_fffffffffffff6e0,
                               (optional<helics::ActionMessage> *)in_stack_fffffffffffff6d8);
                    std::optional<helics::ActionMessage>::~optional
                              ((optional<helics::ActionMessage> *)0x51903a);
                  }
                  local_19c = 1;
                  std::optional<helics::ActionMessage>::~optional
                            ((optional<helics::ActionMessage> *)0x51906d);
                }
                else {
                  if (local_25c != cmd_terminate_immediately) {
                    if (local_25c == cmd_base_configure) {
                      baseConfigure((BrokerBase *)in_stack_fffffffffffff6f0.__r,
                                    (ActionMessage *)
                                    CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
                    }
                    else if (local_25c == cmd_ping) {
                      local_400 = 0;
                      bVar1 = GlobalFederateId::operator!=(&local_258.source_id,(GlobalBrokerId)0x0)
                      ;
                      if (bVar1) {
                        local_188 = local_188 + 1;
                      }
                      (*in_RDI->_vptr_BrokerBase[5])(in_RDI,&local_258);
                    }
                    else if ((local_25c == cmd_error_check) &&
                            (BVar2 = CLI::std::atomic<helics::BrokerBase::BrokerState>::load
                                               (&in_RDI->brokerState,seq_cst),
                            BVar2 == CONNECTED_ERROR)) {
                      local_3b8 = std::chrono::_V2::steady_clock::now();
                      local_3c0 = (rep)std::chrono::operator-
                                                 ((
                                                  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff6ec,
                                                             in_stack_fffffffffffff6e8),
                                                  (
                                                  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                                  *)in_stack_fffffffffffff6e0);
                      in_stack_fffffffffffff720 =
                           TimeRepresentation<count_time<9,_long>_>::to_ms
                                     ((TimeRepresentation<count_time<9,_long>_> *)
                                      in_stack_fffffffffffff6d8);
                      local_3d0 = in_stack_fffffffffffff720.__r;
                      in_stack_fffffffffffff71f =
                           std::chrono::
                           operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                     ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                      in_stack_fffffffffffff708,
                                      (duration<long,_std::ratio<1L,_1000L>_> *)
                                      CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700))
                      ;
                      local_3c1 = in_stack_fffffffffffff71f._M_value;
                      CLI::std::__cmp_cat::__unspec::__unspec(&local_3d1,(__unspec *)0x0);
                      bVar1 = CLI::std::operator>(local_3c1);
                      if (bVar1) {
                        ActionMessage::setAction(&local_258,cmd_user_disconnect);
                        addActionMessage(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
                      }
                      else {
                        in_stack_fffffffffffff708 = &in_RDI->tickTimer;
                        local_3ec = 2;
                        in_stack_fffffffffffff710 =
                             std::chrono::operator*
                                       ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                        CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8
                                                ),(int *)in_stack_fffffffffffff6e0);
                        local_3e8 = in_stack_fffffffffffff710.__r;
                        TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                                  ((TimeRepresentation<count_time<9,_long>_> *)
                                   CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                                   in_stack_fffffffffffff6f0);
                        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                                          (in_stack_fffffffffffff708,&local_3e0);
                        in_stack_fffffffffffff707 = 1;
                        if (!bVar1) {
                          in_stack_fffffffffffff707 = in_RDI->disable_timer;
                        }
                        if ((in_stack_fffffffffffff707 & 1) != 0) {
                          local_3fc = 200;
                          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                                    (local_3f8,&local_3fc);
                          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                                    ((duration<long,_std::ratio<1L,_1000L>_> *)
                                     in_stack_fffffffffffff720.__r);
                          addActionMessage(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
                        }
                      }
                    }
                    goto LAB_0051907e;
                  }
                  queueProcessingLoop::anon_class_32_4_dda494f4::operator()
                            ((anon_class_32_4_dda494f4 *)in_stack_fffffffffffff720.__r);
                  CLI::std::atomic<bool>::store
                            ((atomic<bool> *)
                             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                             SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x38,0),
                             (memory_order)in_stack_fffffffffffff6e0);
                  queueProcessingLoop::anon_class_16_2_af978e1b::operator()
                            ((anon_class_16_2_af978e1b *)in_stack_fffffffffffff7a8.__d.__r);
                  gmlc::containers::
                  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                  ::try_pop((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                             *)CONCAT17(in_stack_fffffffffffff71f._M_value,in_stack_fffffffffffff718
                                       ));
                  while (bVar1 = std::optional::operator_cast_to_bool
                                           ((optional<helics::ActionMessage> *)0x518a9c), bVar1) {
                    std::optional<helics::ActionMessage>::operator*
                              ((optional<helics::ActionMessage> *)0x518ab2);
                    bVar1 = isDisconnectCommand((ActionMessage *)
                                                CONCAT44(in_stack_fffffffffffff6ec,
                                                         in_stack_fffffffffffff6e8));
                    if ((!bVar1) &&
                       (_Var4 = std::__atomic_base::operator_cast_to_int
                                          ((__atomic_base<int> *)
                                           CONCAT44(in_stack_fffffffffffff6ec,
                                                    in_stack_fffffffffffff6e8)), 0x17 < _Var4)) {
                      local_4c8 = (in_RDI->global_broker_id_local).gid;
                      GlobalFederateId::GlobalFederateId(local_4c4,(GlobalBrokerId)local_4c8);
                      local_4d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffff6e0);
                      in_stack_fffffffffffff6f8 = local_529;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff720.__r,
                                 (char *)CONCAT17(in_stack_fffffffffffff71f._M_value,
                                                  in_stack_fffffffffffff718),
                                 (allocator<char> *)in_stack_fffffffffffff710.__r);
                      std::optional<helics::ActionMessage>::operator*
                                ((optional<helics::ActionMessage> *)0x518b5d);
                      prettyPrintString_abi_cxx11_(in_stack_fffffffffffff9a0);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffff71f._M_value,
                                                 in_stack_fffffffffffff718),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff710.__r);
                      local_4e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffff6e0);
                      in_stack_fffffffffffff6d8 = (ActionMessage *)local_4e8._M_len;
                      in_stack_fffffffffffff6e0 = (BrokerBase *)local_4e8._M_str;
                      sendToLogger(in_stack_fffffffffffff840,in_stack_fffffffffffff85c,
                                   in_stack_fffffffffffff83c,in_stack_fffffffffffff848,
                                   in_stack_fffffffffffff980,(bool)in_stack_fffffffffffff83b);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff6e0);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff6e0);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff6e0);
                      std::allocator<char>::~allocator((allocator<char> *)local_529);
                    }
                    gmlc::containers::
                    BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                    ::try_pop((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                               *)CONCAT17(in_stack_fffffffffffff71f._M_value,
                                          in_stack_fffffffffffff718));
                    std::optional<helics::ActionMessage>::operator=
                              ((optional<helics::ActionMessage> *)in_stack_fffffffffffff6e0,
                               (optional<helics::ActionMessage> *)in_stack_fffffffffffff6d8);
                    std::optional<helics::ActionMessage>::~optional
                              ((optional<helics::ActionMessage> *)0x518cee);
                  }
                  std::optional<helics::ActionMessage>::~optional
                            ((optional<helics::ActionMessage> *)0x518d16);
                  local_19c = 1;
                }
                goto LAB_00519089;
              }
              bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                                (&local_258,error_flag);
              if (bVar1) {
                CLI::std::
                unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                ::operator=((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                             *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
                std::
                __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x518237);
                gmlc::networking::AsioContextManager::startContextLoop(in_stack_fffffffffffff868);
                CLI::std::
                unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                ::operator=((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                             *)in_stack_fffffffffffff6e0,
                            (unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                             *)in_stack_fffffffffffff6d8);
                std::
                unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                               *)in_stack_fffffffffffff6f0.__r);
              }
              BVar2 = CLI::std::atomic<helics::BrokerBase::BrokerState>::load
                                (&in_RDI->brokerState,seq_cst);
              if (BVar2 == CONNECTED_ERROR) {
                local_270 = std::chrono::_V2::steady_clock::now();
                local_278 = (rep)std::chrono::operator-
                                           ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                             *)CONCAT44(in_stack_fffffffffffff6ec,
                                                        in_stack_fffffffffffff6e8),
                                            (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                             *)in_stack_fffffffffffff6e0);
                local_288 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ms
                                           ((TimeRepresentation<count_time<9,_long>_> *)
                                            in_stack_fffffffffffff6d8);
                local_279 = (type)std::chrono::
                                  operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                             in_stack_fffffffffffff708,
                                             (duration<long,_std::ratio<1L,_1000L>_> *)
                                             CONCAT17(in_stack_fffffffffffff707,
                                                      in_stack_fffffffffffff700));
                CLI::std::__cmp_cat::__unspec::__unspec(&local_289,(__unspec *)0x0);
                bVar1 = CLI::std::operator>=(local_279);
                if (bVar1) {
                  ActionMessage::setAction(&local_258,cmd_user_disconnect);
                  addActionMessage(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
                }
                else if ((in_RDI->disable_timer & 1U) == 0) {
                  local_2a0 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ns
                                             ((TimeRepresentation<count_time<9,_long>_> *)
                                              in_stack_fffffffffffff6d8);
                  local_298.__r =
                       (rep)std::chrono::operator+
                                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)CONCAT44(in_stack_fffffffffffff6ec,
                                                   in_stack_fffffffffffff6e8),
                                       (duration<long,_std::ratio<1L,_1000000000L>_> *)
                                       in_stack_fffffffffffff6e0);
                  ::asio::
                  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                                *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
                               in_stack_fffffffffffff6f8);
                  local_2a3 = 1;
                  local_2a4 = 1;
                  local_2a2 = std::make_pair<bool,bool>
                                        ((bool *)in_stack_fffffffffffff6d8,(bool *)0x518438);
                  gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                            ((guarded<std::pair<bool,_bool>,_std::mutex> *)
                             in_stack_fffffffffffff6f0.__r,
                             (pair<bool,_bool> *)
                             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
                  ::asio::
                  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  ::
                  async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                            ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                              *)in_stack_fffffffffffff6e0,(type *)in_stack_fffffffffffff6d8);
                }
                else {
                  ActionMessage::setAction(&local_258,cmd_error_check);
                  addActionMessage(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
                }
              }
              else {
                if (local_188 == 0) {
                  local_258.messageID = in_RDI->forwardingReasons | 1;
                  (*in_RDI->_vptr_BrokerBase[5])(in_RDI,&local_258);
                }
                else if ((in_RDI->forwardTick & 1U) != 0) {
                  local_258.messageID = in_RDI->forwardingReasons;
                }
                local_188 = 0;
                local_2b0 = std::chrono::_V2::steady_clock::now();
                bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                                  (&in_RDI->maxCoSimDuration,
                                   (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
                if (bVar1) {
                  local_2c0 = (rep)std::chrono::operator-
                                             ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                               *)CONCAT44(in_stack_fffffffffffff6ec,
                                                          in_stack_fffffffffffff6e8),
                                              (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                               *)in_stack_fffffffffffff6e0);
                  local_2c8 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ms
                                             ((TimeRepresentation<count_time<9,_long>_> *)
                                              in_stack_fffffffffffff6d8);
                  local_2b1 = (type)std::chrono::
                                    operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                              ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                               in_stack_fffffffffffff708,
                                               (duration<long,_std::ratio<1L,_1000L>_> *)
                                               CONCAT17(in_stack_fffffffffffff707,
                                                        in_stack_fffffffffffff700));
                  CLI::std::__cmp_cat::__unspec::__unspec(&local_2c9,(__unspec *)0x0);
                  bVar1 = CLI::std::operator>(local_2b1);
                  if (bVar1) {
                    ActionMessage::ActionMessage
                              ((ActionMessage *)
                               CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
                               (action_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20));
                    local_390 = (in_RDI->global_broker_id_local).gid;
                    GlobalFederateId::GlobalFederateId(local_38c,(GlobalBrokerId)local_390);
                    local_380 = local_38c[0].gid;
                    local_398 = (in_RDI->global_broker_id_local).gid;
                    GlobalFederateId::GlobalFederateId(&local_394,(GlobalBrokerId)local_398);
                    local_378 = local_394.gid;
                    addActionMessage(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
                    local_19c = 4;
                    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff6e0);
                    goto LAB_0051907e;
                  }
                }
                bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                                  (&in_RDI->tickTimer,
                                   (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
                if ((bVar1) && ((in_RDI->disable_timer & 1U) == 0)) {
                  local_3a8 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ns
                                             ((TimeRepresentation<count_time<9,_long>_> *)
                                              in_stack_fffffffffffff6d8);
                  local_3a0.__r =
                       (rep)std::chrono::operator+
                                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)CONCAT44(in_stack_fffffffffffff6ec,
                                                   in_stack_fffffffffffff6e8),
                                       (duration<long,_std::ratio<1L,_1000000000L>_> *)
                                       in_stack_fffffffffffff6e0);
                  ::asio::
                  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                                *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
                               in_stack_fffffffffffff6f8);
                  local_3ab = 1;
                  local_3ac = 1;
                  local_3aa = std::make_pair<bool,bool>
                                        ((bool *)in_stack_fffffffffffff6d8,(bool *)0x518787);
                  gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                            ((guarded<std::pair<bool,_bool>,_std::mutex> *)
                             in_stack_fffffffffffff6f0.__r,
                             (pair<bool,_bool> *)
                             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
                  ::asio::
                  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  ::
                  async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                            ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                              *)in_stack_fffffffffffff6e0,(type *)in_stack_fffffffffffff6d8);
                }
              }
            }
LAB_0051907e:
            local_19c = 0;
          }
        }
LAB_00519089:
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff6e0);
        in_stack_fffffffffffff6ec = local_19c;
      } while ((local_19c == 0) || (local_19c == 2));
    }
    ::asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::~basic_waitable_timer
              ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                *)0x5190d7);
    std::
    unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
    ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                   *)in_stack_fffffffffffff6f0.__r);
    std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
              ((shared_ptr<gmlc::networking::AsioContextManager> *)0x5190f1);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               in_stack_fffffffffffff6f0.__r);
  }
  return;
}

Assistant:

void BrokerBase::queueProcessingLoop()
{
    if (haltOperations) {
        mainLoopIsRunning.store(false);
        return;
    }
    std::vector<ActionMessage> dumpMessages;
#ifndef HELICS_DISABLE_ASIO
    auto serv = gmlc::networking::AsioContextManager::getContextPointer();
    auto contextLoop = serv->startContextLoop();
    asio::steady_timer ticktimer(serv->getBaseContext());
    activeProtector active(true, false);

    auto timerCallback = [this, &active](const std::error_code& errorCode) {
        timerTickHandler(this, active, errorCode);
    };
    if (tickTimer > timeZero && !disable_timer) {
        if (tickTimer < Time(0.5)) {
            tickTimer = Time(0.5);
        }
        active = std::make_pair(true, true);
        ticktimer.expires_at(std::chrono::steady_clock::now() + tickTimer.to_ns());
        ticktimer.async_wait(timerCallback);
    }
    auto timerStop = [&, this]() {
        if (!haltTimer(active, ticktimer)) {
            sendToLogger(global_broker_id_local,
                         LogLevels::WARNING,
                         identifier,
                         "timer unable to cancel properly");
        }
        contextLoop = nullptr;
    };
    auto timeStart = std::chrono::steady_clock::now();
#else
    auto timerStop = []() {};
#endif

    global_broker_id_local = global_id.load();
    int messagesSinceLastTick = 0;
    auto logDump = [&, this]() {
        if (!dumpMessages.empty()) {
            for (auto& act : dumpMessages) {
                mLogManager->sendToLogger(HELICS_LOG_LEVEL_DUMPLOG,
                                          identifier,
                                          fmt::format("|| dl cmd:{} from {} to {}",
                                                      prettyPrintString(act),
                                                      act.source_id.baseValue(),
                                                      act.dest_id.baseValue()));
            }
        }
    };
    if (haltOperations) {
        timerStop();
        mainLoopIsRunning.store(false);
        return;
    }
    while (true) {
        auto command = actionQueue.pop();
        ++messageCounter;
        if (dumplog) {
            dumpMessages.push_back(command);
        }
        if (command.action() == CMD_IGNORE) {
            continue;
        }
        auto ret = commandProcessor(command);
        if (ret == CMD_IGNORE) {
            ++messagesSinceLastTick;
            continue;
        }
        switch (ret) {
            case CMD_TICK:
                if (checkActionFlag(command, error_flag)) {
#ifndef HELICS_DISABLE_ASIO
                    contextLoop = nullptr;
                    contextLoop = serv->startContextLoop();
#endif
                }
                // deal with error state timeout
                if (brokerState.load() == BrokerState::CONNECTED_ERROR) {
                    auto ctime = std::chrono::steady_clock::now();
                    auto timeDiff = ctime - errorTimeStart;
                    if (timeDiff >= errorDelay.to_ms()) {
                        command.setAction(CMD_USER_DISCONNECT);
                        addActionMessage(command);
                    } else {
#ifndef HELICS_DISABLE_ASIO
                        if (!disable_timer) {
                            ticktimer.expires_at(errorTimeStart + errorDelay.to_ns());
                            active = std::make_pair(true, true);
                            ticktimer.async_wait(timerCallback);
                        } else {
                            command.setAction(CMD_ERROR_CHECK);
                            addActionMessage(command);
                        }
#else
                        command.setAction(CMD_ERROR_CHECK);
                        addActionMessage(command);
#endif
                    }
                    break;
                }
#ifndef DISABLE_TICK
                if (messagesSinceLastTick == 0) {
                    command.messageID =
                        forwardingReasons | static_cast<uint32_t>(TickForwardingReasons::NO_COMMS);
                    processCommand(std::move(command));
                } else if (forwardTick) {
                    command.messageID = forwardingReasons;
                }
#endif
                messagesSinceLastTick = 0;
// reschedule the timer
#ifndef HELICS_DISABLE_ASIO
                {
                    auto currTime = std::chrono::steady_clock::now();
                    if (maxCoSimDuration > timeZero) {
                        if ((currTime - timeStart) > maxCoSimDuration.to_ms()) {
                            ActionMessage dDisable(CMD_TIMEOUT_DISCONNECT);
                            dDisable.source_id = global_broker_id_local;
                            dDisable.dest_id = global_broker_id_local;
                            addActionMessage(dDisable);
                            break;
                        }
                    }
                    if (tickTimer > timeZero && !disable_timer) {
                        ticktimer.expires_at(currTime + tickTimer.to_ns());
                        active = std::make_pair(true, true);
                        ticktimer.async_wait(timerCallback);
                    }
                }
#endif
                break;
            case CMD_ERROR_CHECK:
                if (brokerState.load() == BrokerState::CONNECTED_ERROR) {
                    auto ctime = std::chrono::steady_clock::now();
                    auto timeDiff = ctime - errorTimeStart;
                    if (timeDiff > errorDelay.to_ms()) {
                        command.setAction(CMD_USER_DISCONNECT);
                        addActionMessage(command);
                    } else {
#ifndef HELICS_DISABLE_ASIO
                        if (tickTimer > timeDiff * 2 || disable_timer) {
                            std::this_thread::sleep_for(std::chrono::milliseconds(200));
                            addActionMessage(command);
                        }
#else
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                        addActionMessage(command);
#endif
                    }
                }
                break;
            case CMD_PING:
                // ping is processed normally but doesn't count as an actual message for timeout
                // purposes unless it comes from the parent
                if (command.source_id != parent_broker_id) {
                    ++messagesSinceLastTick;
                }
                processCommand(std::move(command));
                break;
            case CMD_BASE_CONFIGURE:
                baseConfigure(command);
                break;
            case CMD_IGNORE:
            default:
                break;
            case CMD_TERMINATE_IMMEDIATELY:
                timerStop();
                mainLoopIsRunning.store(false);
                logDump();
                {
                    auto tcmd = actionQueue.try_pop();
                    while (tcmd) {
                        if (!isDisconnectCommand(*tcmd)) {
                            LOG_TRACE(global_broker_id_local,
                                      identifier,
                                      std::string("TI unprocessed command ") +
                                          prettyPrintString(*tcmd));
                        }
                        tcmd = actionQueue.try_pop();
                    }
                }
                return;  // immediate return
            case CMD_STOP:
                timerStop();
                if (!haltOperations) {
                    processCommand(std::move(command));
                    mainLoopIsRunning.store(false);
                    logDump();
                    processDisconnect();
                }
                auto tcmd = actionQueue.try_pop();
                while (tcmd) {
                    if (!isDisconnectCommand(*tcmd)) {
                        LOG_TRACE(global_broker_id_local,
                                  identifier,
                                  std::string("STOPPED unprocessed command ") +
                                      prettyPrintString(*tcmd));
                    }
                    tcmd = actionQueue.try_pop();
                }
                return;
        }
    }
}